

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  string *psVar2;
  string *this;
  char *pcVar3;
  basic_istream<char,_std::char_traits<char>_> *pbVar4;
  Controller *this_00;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Controller *local_48;
  Controller *controller;
  string *psStack_38;
  bool choice;
  string *argument;
  string *operation;
  string *name;
  Logger *logger;
  Tools *tools;
  
  tools._4_4_ = 0;
  logger = (Logger *)Tools::getInstance();
  name = &Logger::getInstance()->loggerPath;
  psVar2 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)psVar2);
  operation = psVar2;
  psVar2 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)psVar2);
  argument = psVar2;
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string(this);
  controller._7_1_ = 1;
  psStack_38 = this;
  while (psVar2 = operation, (controller._7_1_ & 1) != 0) {
    pcVar3 = (char *)std::__cxx11::string::data();
    pbVar4 = std::operator>>((basic_istream<char,_std::char_traits<char>_> *)&std::cin,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::data();
    pbVar4 = std::operator>>(pbVar4,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::data();
    std::operator>>(pbVar4,pcVar3);
    pcVar3 = (char *)std::__cxx11::string::data();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar3,&local_69);
    bVar1 = std::operator==(&local_68,"ex");
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    if (bVar1) {
      controller._7_1_ = 0;
    }
    this_00 = (Controller *)operator_new(0x20);
    pcVar3 = (char *)std::__cxx11::string::data();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar3,&local_a1);
    pcVar3 = (char *)std::__cxx11::string::data();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar3,&local_c9);
    Controller::Controller(this_00,&local_a0,&local_c8);
    local_48 = this_00;
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  if (operation != (string *)0x0) {
    std::__cxx11::string::~string((string *)operation);
    operator_delete(psVar2,0x20);
  }
  psVar2 = argument;
  if (argument != (string *)0x0) {
    std::__cxx11::string::~string((string *)argument);
    operator_delete(psVar2,0x20);
  }
  if (local_48 != (Controller *)0x0) {
    (*(local_48->
      super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._vptr_ControllerBase[3])();
  }
  return 0;
}

Assistant:

int main() {
    Tools *tools = Tools::getInstance();
    Logger *logger = Logger::getInstance();
    string *name = new string();
    string *operation = new string();
    string *argument = new string();
    bool choice = true;
    Controller *controller;
    while (choice) {
        cin >> name->data() >> operation->data() >> argument->data();
        if (string(name->data()) == "ex") {
            choice = false;
        }
        controller = new Controller(operation->data(), argument->data());
    }

    delete name;
    delete operation;
    delete controller;

    return 0;
}